

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

void PHYSFS_setErrorCode(PHYSFS_ErrorCode errcode)

{
  ErrState *pEVar1;
  void *pvVar2;
  
  if (errcode != PHYSFS_ERR_OK) {
    pEVar1 = findErrorForCurrentThread();
    if (pEVar1 == (ErrState *)0x0) {
      pEVar1 = (ErrState *)(*__PHYSFS_AllocatorHooks.Malloc)(0x18);
      if (pEVar1 == (ErrState *)0x0) {
        return;
      }
      pEVar1->tid = (void *)0x0;
      *(undefined8 *)&pEVar1->code = 0;
      pEVar1->next = (__PHYSFS_ERRSTATETYPE__ *)0x0;
      pvVar2 = __PHYSFS_platformGetThreadID();
      pEVar1->tid = pvVar2;
      if (errorLock == (void *)0x0) {
        pEVar1->next = errorStates;
        errorStates = pEVar1;
      }
      else {
        __PHYSFS_platformGrabMutex(errorLock);
        pvVar2 = errorLock;
        pEVar1->next = errorStates;
        errorStates = pEVar1;
        if (pvVar2 != (void *)0x0) {
          __PHYSFS_platformReleaseMutex(pvVar2);
        }
      }
    }
    pEVar1->code = errcode;
  }
  return;
}

Assistant:

void PHYSFS_setErrorCode(PHYSFS_ErrorCode errcode)
{
    ErrState *err;

    if (!errcode)
        return;

    err = findErrorForCurrentThread();
    if (err == NULL)
    {
        err = (ErrState *) allocator.Malloc(sizeof (ErrState));
        if (err == NULL)
            return;   /* uhh...? */

        memset(err, '\0', sizeof (ErrState));
        err->tid = __PHYSFS_platformGetThreadID();

        if (errorLock != NULL)
            __PHYSFS_platformGrabMutex(errorLock);

        err->next = errorStates;
        errorStates = err;

        if (errorLock != NULL)
            __PHYSFS_platformReleaseMutex(errorLock);
    } /* if */

    err->code = errcode;
}